

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O1

void get_msurf_descriptor_inlinedHaarWavelets_precheck_boundaries
               (integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  interest_point *piVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  float *data;
  int iVar19;
  int iVar20;
  int iVar21;
  uint scale;
  int iVar22;
  int iVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  float fVar68;
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 in_register_00001404 [12];
  float ry;
  float rx;
  int local_110;
  int local_10c;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [8];
  undefined8 uStack_e0;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  long local_b8;
  float local_ac;
  interest_point *local_a8;
  integral_image *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  ulong local_38;
  undefined1 auVar65 [64];
  
  local_98._8_8_ = local_98._0_8_;
  fVar30 = ipoint->scale;
  auVar69 = ZEXT464((uint)fVar30);
  auVar26._8_4_ = 0x80000000;
  auVar26._0_8_ = 0x8000000080000000;
  auVar26._12_4_ = 0x80000000;
  auVar27._8_4_ = 0x3effffff;
  auVar27._0_8_ = 0x3effffff3effffff;
  auVar27._12_4_ = 0x3effffff;
  auVar25 = vpternlogd_avx512vl(auVar27,ZEXT416((uint)fVar30),auVar26,0xf8);
  auVar25 = ZEXT416((uint)(fVar30 + auVar25._0_4_));
  auVar25 = vroundss_avx(auVar25,auVar25,0xb);
  scale = (uint)auVar25._0_4_;
  fVar60 = -0.08 / (fVar30 * fVar30);
  auVar25 = vpternlogd_avx512vl(auVar27,ZEXT416((uint)ipoint->x),auVar26,0xf8);
  auVar25 = ZEXT416((uint)(ipoint->x + auVar25._0_4_));
  auVar25 = vroundss_avx(auVar25,auVar25,0xb);
  auVar62._0_8_ = (double)auVar25._0_4_;
  auVar62._8_8_ = auVar25._8_8_;
  auVar66._0_8_ = (double)fVar30;
  auVar66._8_8_ = 0;
  auVar25 = vfmadd231sd_fma(auVar62,auVar66,ZEXT816(0x3fe0000000000000));
  auVar70._0_4_ = (float)auVar25._0_8_;
  auVar70._4_12_ = auVar25._4_12_;
  auVar25 = vpternlogd_avx512vl(auVar27,ZEXT416((uint)ipoint->y),auVar26,0xf8);
  auVar25 = ZEXT416((uint)(ipoint->y + auVar25._0_4_));
  auVar25 = vroundss_avx(auVar25,auVar25,0xb);
  auVar63._0_8_ = (double)auVar25._0_4_;
  auVar63._8_8_ = auVar25._8_8_;
  auVar25 = vfmadd231sd_fma(auVar63,auVar66,ZEXT816(0x3fe0000000000000));
  fVar61 = (float)auVar25._0_8_;
  auVar25 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar30),auVar70);
  auVar26 = vpternlogd_avx512vl(auVar27,auVar25,auVar26,0xf8);
  auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_));
  auVar25 = vroundss_avx(auVar25,auVar25,0xb);
  local_88 = ZEXT416((uint)fVar30);
  local_a8 = ipoint;
  local_a0 = iimage;
  if ((int)scale < (int)auVar25._0_4_) {
    auVar25 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),local_88,ZEXT416((uint)fVar61));
    auVar64._8_4_ = 0x3effffff;
    auVar64._0_8_ = 0x3effffff3effffff;
    auVar64._12_4_ = 0x3effffff;
    auVar65 = ZEXT1664(auVar64);
    auVar51._8_4_ = 0x80000000;
    auVar51._0_8_ = 0x8000000080000000;
    auVar51._12_4_ = 0x80000000;
    auVar26 = vpternlogd_avx512vl(auVar51,auVar25,auVar64,0xea);
    auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_));
    auVar25 = vroundss_avx(auVar25,auVar25,0xb);
    if ((int)scale < (int)auVar25._0_4_) {
      auVar25 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),local_88,ZEXT416((uint)auVar70._0_4_)
                               );
      auVar52._8_4_ = 0x80000000;
      auVar52._0_8_ = 0x8000000080000000;
      auVar52._12_4_ = 0x80000000;
      auVar26 = vpternlogd_avx512vl(auVar52,auVar25,auVar64,0xea);
      auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_));
      auVar25 = vroundss_avx(auVar25,auVar25,0xb);
      if ((int)((int)auVar25._0_4_ + scale) <= iimage->width) {
        auVar25 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),local_88,ZEXT416((uint)fVar61));
        auVar53._8_4_ = 0x80000000;
        auVar53._0_8_ = 0x8000000080000000;
        auVar53._12_4_ = 0x80000000;
        auVar26 = vpternlogd_avx512vl(auVar53,auVar25,auVar64,0xea);
        auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_));
        auVar25 = vroundss_avx(auVar25,auVar25,0xb);
        if ((int)((int)auVar25._0_4_ + scale) <= iimage->height) {
          pfVar1 = iimage->data;
          uVar10 = 0xfffffff8;
          fVar68 = -2.5;
          fVar30 = 0.0;
          uVar11 = 0;
          auVar67 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          lVar17 = 0;
          do {
            fVar68 = fVar68 + 1.0;
            auVar25._0_4_ = (float)(int)uVar10;
            auVar25._4_12_ = in_register_00001404;
            local_b8 = CONCAT44(local_b8._4_4_,fVar68 * fVar68);
            auVar25 = vfmadd213ss_fma(auVar25,auVar69._0_16_,ZEXT416((uint)auVar70._0_4_));
            auVar26 = vpternlogd_avx512vl(auVar65._0_16_,auVar25,auVar67._0_16_,0xf8);
            auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_));
            auVar25 = vroundss_avx(auVar25,auVar25,0xb);
            auVar42._0_4_ = (int)auVar25._0_4_;
            auVar42._4_4_ = (int)auVar25._4_4_;
            auVar42._8_4_ = (int)auVar25._8_4_;
            auVar42._12_4_ = (int)auVar25._12_4_;
            local_98 = vcvtdq2ps_avx(auVar42);
            lVar17 = (long)(int)lVar17;
            local_10c = -3;
            fVar29 = -2.5;
            uVar12 = 0xfffffff8;
            local_c8 = uVar11;
            local_c0 = uVar10;
            do {
              local_78._0_8_ = lVar17;
              fVar29 = fVar29 + 1.0;
              auVar43._0_4_ = (float)(int)uVar12;
              auVar43._4_12_ = in_register_00001404;
              auVar25 = vfmadd213ss_fma(auVar43,auVar69._0_16_,ZEXT416((uint)fVar61));
              auVar26 = vpternlogd_avx512vl(auVar65._0_16_,auVar25,auVar67._0_16_,0xf8);
              auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_));
              auVar25 = vroundss_avx(auVar25,auVar25,0xb);
              iVar23 = (int)uVar12 + -4;
              auVar44._0_4_ = (int)auVar25._0_4_;
              auVar44._4_4_ = (int)auVar25._4_4_;
              auVar44._8_4_ = (int)auVar25._8_4_;
              auVar44._12_4_ = (int)auVar25._12_4_;
              local_68 = vcvtdq2ps_avx(auVar44);
              _local_e8 = ZEXT816(0) << 0x20;
              local_d0 = uVar12;
              do {
                auVar26 = local_58;
                uVar10 = local_c8;
                auVar45._0_4_ = (float)iVar23;
                auVar45._4_12_ = in_register_00001404;
                auVar25 = vfmadd213ss_fma(auVar45,auVar69._0_16_,ZEXT416((uint)fVar61));
                auVar27 = vpternlogd_avx512vl(auVar65._0_16_,auVar25,auVar67._0_16_,0xf8);
                auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar27._0_4_));
                auVar25 = vroundss_avx(auVar25,auVar25,0xb);
                iVar9 = (int)auVar25._0_4_;
                auVar46._0_4_ = (int)auVar25._0_4_;
                auVar46._4_4_ = (int)auVar25._4_4_;
                auVar46._8_4_ = (int)auVar25._8_4_;
                auVar46._12_4_ = (int)auVar25._12_4_;
                auVar25 = vcvtdq2ps_avx(auVar46);
                fVar28 = (float)local_68._0_4_ - auVar25._0_4_;
                uVar15 = iVar9 + ~scale;
                local_58._4_4_ = 0;
                local_58._0_4_ = uVar15;
                local_48 = (ulong)(iVar9 - 1);
                local_58._8_8_ = auVar26._8_8_;
                iVar9 = -0xc;
                do {
                  auVar47._0_4_ = (float)((int)uVar10 + iVar9);
                  auVar47._4_12_ = in_register_00001404;
                  auVar25 = vfmadd213ss_fma(auVar47,auVar69._0_16_,ZEXT416((uint)auVar70._0_4_));
                  auVar26 = vpternlogd_avx512vl(auVar65._0_16_,auVar25,auVar67._0_16_,0xf8);
                  auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_));
                  auVar25 = vroundss_avx(auVar25,auVar25,0xb);
                  iVar14 = (int)auVar25._0_4_;
                  auVar48._0_4_ = (int)auVar25._0_4_;
                  auVar48._4_4_ = (int)auVar25._4_4_;
                  auVar48._8_4_ = (int)auVar25._8_4_;
                  auVar48._12_4_ = (int)auVar25._12_4_;
                  auVar25 = vcvtdq2ps_avx(auVar48);
                  fVar31 = (float)local_98._0_4_ - auVar25._0_4_;
                  fVar31 = expf((fVar31 * fVar31 + fVar28 * fVar28) * fVar60);
                  auVar69 = ZEXT1664(local_88);
                  iVar24 = local_a0->data_width;
                  iVar13 = iVar14 + ~scale;
                  iVar19 = iVar13 + scale * 2;
                  iVar22 = iVar24 * local_58._0_4_;
                  iVar18 = iVar24 * (uVar15 + scale * 2);
                  auVar25 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar22 + -1 + iVar14] -
                                                          pfVar1[iVar18 + -1 + iVar14])),
                                            SUB6416(ZEXT464(0x40000000),0),
                                            ZEXT416((uint)(pfVar1[iVar18 + iVar19] -
                                                          pfVar1[iVar22 + iVar13])));
                  auVar26 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar24 * (int)(float)local_48 +
                                                                  iVar13] -
                                                          pfVar1[iVar24 * (int)(float)local_48 +
                                                                 iVar19])),
                                            SUB6416(ZEXT464(0x40000000),0),
                                            ZEXT416((uint)(pfVar1[iVar18 + iVar19] -
                                                          pfVar1[iVar22 + iVar13])));
                  auVar67 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
                  auVar65 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
                  auVar25 = vinsertps_avx(ZEXT416((uint)(auVar26._0_4_ -
                                                        (pfVar1[iVar13 + iVar18] -
                                                        pfVar1[iVar22 + iVar19]))),
                                          ZEXT416((uint)((pfVar1[iVar13 + iVar18] -
                                                         pfVar1[iVar22 + iVar19]) + auVar25._0_4_)),
                                          0x10);
                  auVar49._0_4_ = fVar31 * auVar25._0_4_;
                  auVar49._4_4_ = fVar31 * auVar25._4_4_;
                  auVar49._8_4_ = fVar31 * auVar25._8_4_;
                  auVar49._12_4_ = fVar31 * auVar25._12_4_;
                  auVar7._8_4_ = 0x7fffffff;
                  auVar7._0_8_ = 0x7fffffff7fffffff;
                  auVar7._12_4_ = 0x7fffffff;
                  auVar25 = vandps_avx512vl(auVar49,auVar7);
                  auVar25 = vmovlhps_avx(auVar49,auVar25);
                  local_e8._4_4_ = (float)local_e8._4_4_ + auVar25._4_4_;
                  local_e8._0_4_ = (float)local_e8._0_4_ + auVar25._0_4_;
                  uStack_e0._0_4_ = (float)uStack_e0 + auVar25._8_4_;
                  uStack_e0._4_4_ = uStack_e0._4_4_ + auVar25._12_4_;
                  iVar9 = iVar9 + 1;
                } while (iVar9 != -3);
                iVar23 = iVar23 + 1;
              } while (iVar23 != local_10c);
              iVar23 = (int)local_d0;
              fVar28 = expf((fVar29 * fVar29 + (float)local_b8) * -0.22222222);
              auVar67 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              auVar65 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
              auVar69 = ZEXT1664(local_88);
              auVar50._0_4_ = fVar28 * (float)local_e8._0_4_;
              auVar50._4_4_ = fVar28 * (float)local_e8._4_4_;
              auVar50._8_4_ = fVar28 * (float)uStack_e0;
              auVar50._12_4_ = fVar28 * uStack_e0._4_4_;
              *(undefined1 (*) [16])(local_a8->descriptor + local_78._0_8_) = auVar50;
              auVar59._0_4_ = auVar50._0_4_ * auVar50._0_4_;
              auVar59._4_4_ = auVar50._4_4_ * auVar50._4_4_;
              auVar59._8_4_ = auVar50._8_4_ * auVar50._8_4_;
              auVar59._12_4_ = auVar50._12_4_ * auVar50._12_4_;
              auVar25 = vmovshdup_avx(auVar59);
              auVar26 = vfmadd231ss_fma(auVar25,auVar50,auVar50);
              auVar25 = vshufpd_avx(auVar50,auVar50,1);
              auVar26 = vfmadd213ss_fma(auVar25,auVar25,auVar26);
              auVar25 = vshufps_avx(auVar50,auVar50,0xff);
              auVar25 = vfmadd213ss_fma(auVar25,auVar25,auVar26);
              fVar30 = fVar30 + auVar25._0_4_;
              lVar17 = local_78._0_8_ + 4;
              local_10c = local_10c + 5;
              uVar12 = (ulong)(iVar23 + 5);
            } while (iVar23 < 3);
            uVar10 = (ulong)((int)local_c0 + 5);
            uVar11 = (ulong)((int)local_c8 + 5);
          } while ((int)local_c0 < 3);
          goto LAB_00183ac7;
        }
      }
    }
  }
  local_98._4_4_ = 0;
  local_98._0_4_ = scale * 2;
  uVar10 = 0xfffffff8;
  local_ac = -2.5;
  fVar30 = 0.0;
  iVar23 = 0;
  lVar17 = 0;
  do {
    local_ac = local_ac + 1.0;
    auVar32._0_4_ = (float)(int)uVar10;
    auVar32._4_12_ = in_register_00001404;
    fVar68 = local_ac * local_ac;
    auVar25 = vfmadd213ss_fma(auVar32,auVar69._0_16_,ZEXT416((uint)auVar70._0_4_));
    auVar54._8_4_ = 0x3effffff;
    auVar54._0_8_ = 0x3effffff3effffff;
    auVar54._12_4_ = 0x3effffff;
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    auVar26 = vpternlogd_avx512vl(auVar54,auVar25,auVar2,0xf8);
    auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_));
    auVar25 = vroundss_avx(auVar25,auVar25,0xb);
    auVar33._0_4_ = (int)auVar25._0_4_;
    auVar33._4_4_ = (int)auVar25._4_4_;
    auVar33._8_4_ = (int)auVar25._8_4_;
    auVar33._12_4_ = (int)auVar25._12_4_;
    local_58 = vcvtdq2ps_avx(auVar33);
    lVar17 = (long)(int)lVar17;
    local_110 = -3;
    uVar11 = 0xfffffff8;
    fVar29 = -2.5;
    local_38 = uVar10;
    do {
      local_d0 = CONCAT44(local_d0._4_4_,fVar29 + 1.0);
      auVar34._0_4_ = (float)(int)uVar11;
      auVar34._4_12_ = in_register_00001404;
      auVar25 = vfmadd213ss_fma(auVar34,auVar69._0_16_,ZEXT416((uint)fVar61));
      auVar55._8_4_ = 0x3effffff;
      auVar55._0_8_ = 0x3effffff3effffff;
      auVar55._12_4_ = 0x3effffff;
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar26 = vpternlogd_avx512vl(auVar55,auVar25,auVar3,0xf8);
      auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_));
      auVar25 = vroundss_avx(auVar25,auVar25,0xb);
      iVar9 = (int)uVar11 + -4;
      auVar35._0_4_ = (int)auVar25._0_4_;
      auVar35._4_4_ = (int)auVar25._4_4_;
      auVar35._8_4_ = (int)auVar25._8_4_;
      auVar35._12_4_ = (int)auVar25._12_4_;
      local_78 = vcvtdq2ps_avx(auVar35);
      _local_e8 = ZEXT816(0) << 0x20;
      local_c0 = uVar11;
      local_b8 = lVar17;
      do {
        local_c8 = CONCAT44(local_c8._4_4_,iVar9);
        auVar36._0_4_ = (float)iVar9;
        auVar36._4_12_ = in_register_00001404;
        auVar25 = vfmadd213ss_fma(auVar36,auVar69._0_16_,ZEXT416((uint)fVar61));
        auVar56._8_4_ = 0x3effffff;
        auVar56._0_8_ = 0x3effffff3effffff;
        auVar56._12_4_ = 0x3effffff;
        auVar4._8_4_ = 0x80000000;
        auVar4._0_8_ = 0x8000000080000000;
        auVar4._12_4_ = 0x80000000;
        auVar26 = vpternlogd_avx512vl(auVar56,auVar25,auVar4,0xf8);
        auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_));
        auVar25 = vroundss_avx(auVar25,auVar25,0xb);
        iVar13 = (int)auVar25._0_4_;
        auVar37._0_4_ = (int)auVar25._0_4_;
        auVar37._4_4_ = (int)auVar25._4_4_;
        auVar37._8_4_ = (int)auVar25._8_4_;
        auVar37._12_4_ = (int)auVar25._12_4_;
        auVar25 = vcvtdq2ps_avx(auVar37);
        fVar29 = (float)local_78._0_4_ - auVar25._0_4_;
        iVar19 = iVar13 - scale;
        iVar9 = local_98._0_4_;
        local_68._0_4_ = iVar19 + -1 + iVar9;
        iVar24 = -0xc;
        do {
          auVar38._0_4_ = (float)(iVar23 + iVar24);
          auVar38._4_12_ = in_register_00001404;
          auVar25 = vfmadd213ss_fma(auVar38,auVar69._0_16_,ZEXT416((uint)auVar70._0_4_));
          auVar57._8_4_ = 0x3effffff;
          auVar57._0_8_ = 0x3effffff3effffff;
          auVar57._12_4_ = 0x3effffff;
          auVar5._8_4_ = 0x80000000;
          auVar5._0_8_ = 0x8000000080000000;
          auVar5._12_4_ = 0x80000000;
          auVar26 = vpternlogd_avx512vl(auVar57,auVar25,auVar5,0xf8);
          auVar25 = ZEXT416((uint)(auVar25._0_4_ + auVar26._0_4_));
          auVar25 = vroundss_avx(auVar25,auVar25,0xb);
          iVar22 = (int)auVar25._0_4_;
          auVar39._0_4_ = (int)auVar25._0_4_;
          auVar39._4_4_ = (int)auVar25._4_4_;
          auVar39._8_4_ = (int)auVar25._8_4_;
          auVar39._12_4_ = (int)auVar25._12_4_;
          auVar25 = vcvtdq2ps_avx(auVar39);
          fVar28 = (float)local_58._0_4_ - auVar25._0_4_;
          iVar18 = iVar22 - scale;
          fVar28 = expf(fVar60 * (fVar28 * fVar28 + fVar29 * fVar29));
          local_ec = 0.0;
          local_f0 = 0.0;
          if ((((iVar19 < 1) || (iVar18 < 1)) || (local_a0->height < iVar19 + iVar9)) ||
             (iVar14 = iVar18 + local_98._0_4_, local_a0->width < iVar14)) {
            local_48 = CONCAT44(extraout_XMM0_Db,fVar28);
            haarXY(local_a0,iVar19,iVar18,scale,&local_ec,&local_f0);
            fVar28 = (float)local_48;
          }
          else {
            pfVar1 = local_a0->data;
            iVar16 = local_a0->data_width;
            iVar20 = iVar16 * (iVar19 + -1);
            iVar21 = iVar16 * (iVar13 + -1);
            iVar16 = iVar16 * local_68._0_4_;
            auVar25 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar20 + -1 + iVar22] -
                                                    pfVar1[iVar16 + -1 + iVar22])),
                                      SUB6416(ZEXT464(0x40000000),0),
                                      ZEXT416((uint)(pfVar1[iVar16 + -1 + iVar14] -
                                                    pfVar1[iVar20 + -1 + iVar18])));
            local_ec = (pfVar1[iVar16 + -1 + iVar18] - pfVar1[iVar20 + -1 + iVar14]) + auVar25._0_4_
            ;
            auVar25 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar21 + -1 + iVar18] -
                                                    pfVar1[iVar21 + -1 + iVar14])),
                                      SUB6416(ZEXT464(0x40000000),0),
                                      ZEXT416((uint)(pfVar1[iVar16 + -1 + iVar14] -
                                                    pfVar1[iVar20 + -1 + iVar18])));
            local_f0 = auVar25._0_4_ - (pfVar1[iVar16 + -1 + iVar18] - pfVar1[iVar20 + -1 + iVar14])
            ;
          }
          auVar25 = vinsertps_avx(ZEXT416((uint)local_f0),ZEXT416((uint)local_ec),0x10);
          auVar40._0_4_ = fVar28 * auVar25._0_4_;
          auVar40._4_4_ = fVar28 * auVar25._4_4_;
          auVar40._8_4_ = fVar28 * auVar25._8_4_;
          auVar40._12_4_ = fVar28 * auVar25._12_4_;
          auVar6._8_4_ = 0x7fffffff;
          auVar6._0_8_ = 0x7fffffff7fffffff;
          auVar6._12_4_ = 0x7fffffff;
          auVar25 = vandps_avx512vl(auVar40,auVar6);
          auVar25 = vmovlhps_avx(auVar40,auVar25);
          local_e8._4_4_ = (float)local_e8._4_4_ + auVar25._4_4_;
          local_e8._0_4_ = (float)local_e8._0_4_ + auVar25._0_4_;
          uStack_e0._0_4_ = (float)uStack_e0 + auVar25._8_4_;
          uStack_e0._4_4_ = uStack_e0._4_4_ + auVar25._12_4_;
          iVar24 = iVar24 + 1;
          auVar69 = ZEXT1664(local_88);
        } while (iVar24 != -3);
        iVar9 = (int)local_c8 + 1;
      } while (iVar9 != local_110);
      iVar9 = (int)local_c0;
      fVar29 = expf(((float)local_d0 * (float)local_d0 + fVar68) * -0.22222222);
      auVar69 = ZEXT1664(local_88);
      auVar41._0_4_ = fVar29 * (float)local_e8._0_4_;
      auVar41._4_4_ = fVar29 * (float)local_e8._4_4_;
      auVar41._8_4_ = fVar29 * (float)uStack_e0;
      auVar41._12_4_ = fVar29 * uStack_e0._4_4_;
      *(undefined1 (*) [16])(local_a8->descriptor + local_b8) = auVar41;
      auVar58._0_4_ = auVar41._0_4_ * auVar41._0_4_;
      auVar58._4_4_ = auVar41._4_4_ * auVar41._4_4_;
      auVar58._8_4_ = auVar41._8_4_ * auVar41._8_4_;
      auVar58._12_4_ = auVar41._12_4_ * auVar41._12_4_;
      auVar25 = vmovshdup_avx(auVar58);
      auVar26 = vfmadd231ss_fma(auVar25,auVar41,auVar41);
      auVar25 = vshufpd_avx(auVar41,auVar41,1);
      auVar26 = vfmadd213ss_fma(auVar25,auVar25,auVar26);
      auVar25 = vshufps_avx(auVar41,auVar41,0xff);
      auVar25 = vfmadd213ss_fma(auVar25,auVar25,auVar26);
      fVar30 = fVar30 + auVar25._0_4_;
      lVar17 = local_b8 + 4;
      local_110 = local_110 + 5;
      uVar11 = (ulong)(iVar9 + 5);
      fVar29 = (float)local_d0;
    } while (iVar9 < 3);
    uVar10 = (ulong)((int)local_38 + 5);
    iVar23 = iVar23 + 5;
  } while ((int)local_38 < 3);
LAB_00183ac7:
  piVar8 = local_a8;
  if (fVar30 < 0.0) {
    fVar30 = sqrtf(fVar30);
  }
  else {
    auVar25 = vsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
    fVar30 = auVar25._0_4_;
  }
  auVar69 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar30)));
  lVar17 = 0;
  do {
    auVar65 = vmulps_avx512f(auVar69,*(undefined1 (*) [64])(piVar8->descriptor + lVar17));
    *(undefined1 (*) [64])(piVar8->descriptor + lVar17) = auVar65;
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_inlinedHaarWavelets_precheck_boundaries(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_inlined
        - using haarXY_precheck_boundaries function to compute Haar Wavelet responses at once with very naive reduction of if/MIN usage

    ideas:
        - more sophisticated boundary checking (before the haarXY_precheck_boundaries function call)
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -2.5f;
    float cy;


    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        float cx_squared = cx*cx;
        
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            float cy_squared = cy*cy;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                int sample_y_sub_int_scale = sample_y-int_scale;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    //Get the gaussian weighted x and y responses
                    // NOTE: We use expf here
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            // NOTE: We use expf here
            float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    

    } else { // everything in borders
    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        float cx_squared = cx*cx;
        
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            float cy_squared = cy*cy;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                int sample_y_sub_int_scale = sample_y-int_scale;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    //Get the gaussian weighted x and y responses
                    // NOTE: We use expf here
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_unconditional(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            // NOTE: We use expf here
            float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    }
    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}